

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

char * string_concat(char *a,char *s,char *e)

{
  size_t __n;
  char *__dest;
  size_t local_40;
  char *p;
  size_t sn;
  size_t an;
  char *e_local;
  char *s_local;
  char *a_local;
  
  if (a == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(a);
  }
  __n = (long)e - (long)s;
  __dest = (char *)memory_realloc((void *)0x0,local_40 + __n + 1);
  if (__dest != (char *)0x0) {
    if (a != (char *)0x0) {
      memcpy(__dest,a,local_40);
    }
    memcpy(__dest + local_40,s,__n);
    __dest[local_40 + __n] = '\0';
  }
  return __dest;
}

Assistant:

static
char* string_concat(const char* a, const char* s, const char* e)
{
   size_t an;
   size_t sn;
   char*  p;
       
   an = a ? strlen(a) : 0;
   sn = (size_t)(e - s);
   p = (char*)(memory_realloc(0, an + sn + 1));
   if (p)
   {
       if (a)
           memcpy(p, a, an);
       memcpy(p + an, s, sn);
       p[an + sn] = '\0';
   }

   return p;
}